

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O2

void __thiscall
amrex::STLtools::read_binary_stl_file
          (STLtools *this,string *fname,Real scale,Array<Real,_3> *center,int reverse_normal)

{
  pointer pTVar1;
  Real RVar2;
  int iVar3;
  ostream *poVar4;
  Print *pPVar5;
  long lVar6;
  int i;
  long lVar7;
  long lVar8;
  uint32_t numtris;
  Real local_480;
  IntDescriptor uint32_descr;
  RealDescriptor real32_descr;
  IntDescriptor uint16_descr;
  char tmp [81];
  undefined1 local_3c8 [400];
  ifstream is;
  ostream local_228 [16];
  int aiStack_218 [122];
  
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    local_480 = scale;
    iVar3 = Verbose();
    if (iVar3 != 0) {
      poVar4 = OutStream();
      Print::Print((Print *)&is,poVar4);
      std::operator<<(local_228,"Reading binary STL file ");
      std::operator<<(local_228,(string *)fname);
      std::operator<<(local_228,"\n");
      Print::~Print((Print *)&is);
    }
    IntDescriptor::IntDescriptor(&uint32_descr,4,ReverseOrder);
    IntDescriptor::IntDescriptor(&uint16_descr,2,ReverseOrder);
    RealDescriptor::RealDescriptor
              (&real32_descr,(Long *)FPC::ieee_float,(int *)FPC::reverse_float_order,4);
    std::ifstream::ifstream(&is,(string *)fname,_S_in|_S_bin);
    if (*(int *)((long)aiStack_218 + *(long *)(_is + -0x18)) != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
                     "STLtools::read_binary_stl_file: failed to open ",fname);
      Abort((string *)local_3c8);
      std::__cxx11::string::~string((string *)local_3c8);
    }
    tmp[0x50] = '\0';
    std::istream::read((char *)&is,(long)tmp);
    readIntData<unsigned_int,unsigned_int>(&numtris,1,(istream *)&is,&uint32_descr);
    this->m_num_tri = numtris;
    PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::resize
              (&this->m_tri_pts_h,(long)(int)numtris);
    iVar3 = Verbose();
    if (iVar3 != 0) {
      poVar4 = OutStream();
      Print::Print((Print *)local_3c8,poVar4);
      std::operator<<((ostream *)(local_3c8 + 0x10),"    Number of triangles: ");
      pPVar5 = Print::operator<<((Print *)local_3c8,&this->m_num_tri);
      std::operator<<((ostream *)&pPVar5->ss,"\n");
      Print::~Print((Print *)local_3c8);
    }
    lVar8 = 0;
    for (lVar7 = 0; lVar7 < this->m_num_tri; lVar7 = lVar7 + 1) {
      std::istream::read((char *)&is,(long)tmp);
      pTVar1 = (this->m_tri_pts_h).m_data;
      RealDescriptor::convertToNativeFormat((Real *)(pTVar1 + lVar7),9,tmp + 0xc,&real32_descr);
      for (lVar6 = 0; (int)lVar6 != 0x48; lVar6 = lVar6 + 0x18) {
        *(double *)((long)&(pTVar1->v1).x + lVar6 + lVar8) =
             *(double *)((long)&(pTVar1->v1).x + lVar6 + lVar8) * local_480 + center->_M_elems[0];
        *(double *)((long)&(pTVar1->v1).y + lVar6 + lVar8) =
             *(double *)((long)&(pTVar1->v1).y + lVar6 + lVar8) * local_480 + center->_M_elems[1];
        *(double *)((long)&(pTVar1->v1).z + lVar6 + lVar8) =
             *(double *)((long)&(pTVar1->v1).z + lVar6 + lVar8) * local_480 + center->_M_elems[2];
      }
      if (reverse_normal != 0) {
        pTVar1 = (this->m_tri_pts_h).m_data;
        local_3c8._16_8_ = pTVar1[lVar7].v1.z;
        local_3c8._0_8_ = pTVar1[lVar7].v1.x;
        local_3c8._8_8_ = pTVar1[lVar7].v1.y;
        RVar2 = pTVar1[lVar7].v2.y;
        pTVar1[lVar7].v1.x = pTVar1[lVar7].v2.x;
        pTVar1[lVar7].v1.y = RVar2;
        pTVar1[lVar7].v1.z = pTVar1[lVar7].v2.z;
        pTVar1[lVar7].v2.x = (Real)local_3c8._0_8_;
        pTVar1[lVar7].v2.y = (Real)local_3c8._8_8_;
        pTVar1[lVar7].v2.z = (Real)local_3c8._16_8_;
      }
      lVar8 = lVar8 + 0x48;
    }
    std::ifstream::~ifstream(&is);
    RealDescriptor::~RealDescriptor(&real32_descr);
  }
  return;
}

Assistant:

void
STLtools::read_binary_stl_file (std::string const& fname, Real scale,
                                Array<Real,3> const& center, int reverse_normal)
{
    if (ParallelDescriptor::IOProcessor()) {
        if (amrex::Verbose()) {
            Print() << "Reading binary STL file "<< fname << "\n";
        }

        IntDescriptor uint32_descr(sizeof(uint32_t), IntDescriptor::ReverseOrder);
        IntDescriptor uint16_descr(sizeof(uint16_t), IntDescriptor::ReverseOrder);
        RealDescriptor real32_descr(FPC::ieee_float, FPC::reverse_float_order, 4);

        std::ifstream is(fname, std::istringstream::in|std::ios::binary);
        if (!is.good()) {
            amrex::Abort("STLtools::read_binary_stl_file: failed to open " + fname);
        }

        char tmp[81];
        tmp[80] = '\0';
        is.read(tmp, 80); // Header - 80 bytes

        uint32_t numtris; // uint32 - Number of triangles - 4 bytes
        amrex::readIntData<uint32_t,uint32_t>(&numtris, 1, is, uint32_descr);
        m_num_tri = static_cast<int>(numtris);
        m_tri_pts_h.resize(m_num_tri);

        if (amrex::Verbose()) {
            Print() << "    Number of triangles: " << m_num_tri << "\n";
        }

        for (int i=0; i < m_num_tri; ++i) {
            is.read(tmp, 50);  // 50 bytes for each triangle. Vertex 1 starts at 12 bytes.
            Real* p = &(m_tri_pts_h[i].v1.x);
            RealDescriptor::convertToNativeFormat(p, 9, tmp+12, real32_descr);
            for (int j = 0; j < 3; ++j) {
                p[0] = p[0] * scale + center[0];
                p[1] = p[1] * scale + center[1];
                p[2] = p[2] * scale + center[2];
                p += 3;
            }
            if (reverse_normal) {
                std::swap(m_tri_pts_h[i].v1, m_tri_pts_h[i].v2);
            }
        }
    }
}